

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Node<QGraphicsItem_*,_QPointF> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGraphicsItem*,QPointF>>::findNode<QGraphicsItem*>
          (Data<QHashPrivate::Node<QGraphicsItem*,QPointF>> *this,QGraphicsItem **key)

{
  byte bVar1;
  ulong uVar2;
  Node<QGraphicsItem_*,_QPointF> *pNVar3;
  Bucket BVar4;
  
  uVar2 = ((ulong)*key >> 0x20 ^ (ulong)*key) * -0x2917014799a6026d;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  BVar4 = findBucketWithHash<QGraphicsItem*>
                    (this,key,uVar2 >> 0x20 ^ *(ulong *)(this + 0x18) ^ uVar2);
  bVar1 = (BVar4.span)->offsets[BVar4.index];
  if (bVar1 == 0xff) {
    pNVar3 = (Node<QGraphicsItem_*,_QPointF> *)0x0;
  }
  else {
    pNVar3 = (Node<QGraphicsItem_*,_QPointF> *)
             (((BVar4.span)->entries->storage).data + (uint)bVar1 * 0x18);
  }
  return pNVar3;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }